

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O3

string * __thiscall
ftxui::(anonymous_namespace)::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
          parameters)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  string *psVar4;
  ulong uVar5;
  _anonymous_namespace_ *in_RDX;
  uint __len;
  long *local_58 [2];
  long local_48 [2];
  _anonymous_namespace_ *local_38;
  
  psVar4 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar4;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != in_RDX) {
    psVar4 = (string *)0x1;
    local_38 = in_RDX;
    do {
      uVar1 = *(uint *)this;
      if (psVar4 == (string *)0x0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            __len = __len - 2;
            goto LAB_001460c0;
          }
          if (uVar3 < 1000) {
            __len = __len - 1;
            goto LAB_001460c0;
          }
          if (uVar3 < 10000) goto LAB_001460c0;
          uVar5 = uVar5 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar3);
        __len = __len + 1;
      }
LAB_001460c0:
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_58[0]),__len,__val);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      this = this + 4;
      psVar4 = (string *)0x0;
    } while (this != local_38);
  }
  return psVar4;
}

Assistant:

const std::string DeviceStatusReport(DSRMode ps) {
  return CSI + std::to_string(int(ps)) + "n";
}